

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_is_compressed(char *filename)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  char tmpfilename [1025];
  uchar buffer [2];
  FILE *diskfile;
  char acStack_428 [1038];
  short local_1a;
  FILE *local_18;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,(FILE **)tmpfilename._104_8_
                       );
  if (iVar1 != 0) {
    sVar2 = strlen(local_10);
    if (0x3fc < sVar2) {
      return 0;
    }
    strcpy(acStack_428,local_10);
    strcat(local_10,".gz");
    iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,
                          (FILE **)tmpfilename._104_8_);
    if (iVar1 != 0) {
      strcpy(local_10,acStack_428);
      strcat(local_10,".Z");
      iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,
                            (FILE **)tmpfilename._104_8_);
      if (iVar1 != 0) {
        strcpy(local_10,acStack_428);
        strcat(local_10,".z");
        iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,
                              (FILE **)tmpfilename._104_8_);
        if (iVar1 != 0) {
          strcpy(local_10,acStack_428);
          strcat(local_10,".zip");
          iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,
                                (FILE **)tmpfilename._104_8_);
          if (iVar1 != 0) {
            strcpy(local_10,acStack_428);
            strcat(local_10,"-z");
            iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,
                                  (FILE **)tmpfilename._104_8_);
            if (iVar1 != 0) {
              strcpy(local_10,acStack_428);
              strcat(local_10,"-gz");
              iVar1 = file_openfile((char *)tmpfilename._120_8_,tmpfilename._116_4_,
                                    (FILE **)tmpfilename._104_8_);
              if (iVar1 != 0) {
                strcpy(local_10,acStack_428);
                return 0;
              }
            }
          }
        }
      }
    }
  }
  sVar2 = fread(&local_1a,1,2,local_18);
  if (sVar2 == 2) {
    fclose(local_18);
    if ((((local_1a == -0x74e1) || (local_1a == 0x4b50)) || (local_1a == 0x1e1f)) ||
       ((local_1a == -0x62e1 || (local_1a == -0x5fe1)))) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    fclose(local_18);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int file_is_compressed(char *filename) /* I - FITS file name          */
/*
  Test if the disk file is compressed.  Returns 1 if compressed, 0 if not.
  This may modify the filename string by appending a compression suffex.
*/
{
    FILE *diskfile;
    unsigned char buffer[2];
    char tmpfilename[FLEN_FILENAME];

    /* Open file.  Try various suffix combinations */  
    if (file_openfile(filename, 0, &diskfile))
    {
      if (strlen(filename) > FLEN_FILENAME - 5)
          return(0);

      strcpy(tmpfilename,filename);
      strcat(filename,".gz");
      if (file_openfile(filename, 0, &diskfile))
      {
#if HAVE_BZIP2
        strcpy(filename,tmpfilename);
        strcat(filename,".bz2");
        if (file_openfile(filename, 0, &diskfile))
        {
#endif
        strcpy(filename, tmpfilename);
        strcat(filename,".Z");
        if (file_openfile(filename, 0, &diskfile))
        {
          strcpy(filename, tmpfilename);
          strcat(filename,".z");   /* it's often lower case on CDROMs */
          if (file_openfile(filename, 0, &diskfile))
          {
            strcpy(filename, tmpfilename);
            strcat(filename,".zip");
            if (file_openfile(filename, 0, &diskfile))
            {
              strcpy(filename, tmpfilename);
              strcat(filename,"-z");      /* VMS suffix */
              if (file_openfile(filename, 0, &diskfile))
              {
                strcpy(filename, tmpfilename);
                strcat(filename,"-gz");    /* VMS suffix */
                if (file_openfile(filename, 0, &diskfile))
                {
                  strcpy(filename,tmpfilename);  /* restore original name */
                  return(0);    /* file not found */
                }
              }
            }
          }
        }
#if HAVE_BZIP2
        }
#endif
      }
    }

    if (fread(buffer, 1, 2, diskfile) != 2)  /* read 2 bytes */
    {
        fclose(diskfile);   /* error reading file so just return */
        return(0);
    }

    fclose(diskfile);

       /* see if the 2 bytes have the magic values for a compressed file */
    if ( (memcmp(buffer, "\037\213", 2) == 0) ||  /* GZIP  */
         (memcmp(buffer, "\120\113", 2) == 0) ||  /* PKZIP */
         (memcmp(buffer, "\037\036", 2) == 0) ||  /* PACK  */
         (memcmp(buffer, "\037\235", 2) == 0) ||  /* LZW   */
#if HAVE_BZIP2
         (memcmp(buffer, "BZ",       2) == 0) ||  /* BZip2 */
#endif
         (memcmp(buffer, "\037\240", 2) == 0))  /* LZH   */
        {
            return(1);  /* this is a compressed file */
        }
    else
        {
            return(0);  /* not a compressed file */
        }
}